

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_force(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *pCVar5;
  CHAR_DATA *pCVar6;
  char arg [4608];
  char buf [4608];
  char arg2 [4608];
  
  pcVar4 = one_argument(argument,arg);
  if ((arg[0] == '\0') || (*pcVar4 == '\0')) {
    pcVar4 = "Force whom to do what?\n\r";
    goto LAB_002ca437;
  }
  one_argument(pcVar4,arg2);
  bVar1 = str_cmp(arg2,"delete");
  if ((!bVar1) || (bVar1 = str_prefix(arg2,"mob"), !bVar1)) {
    pcVar4 = "That will NOT be done.\n\r";
    goto LAB_002ca437;
  }
  sprintf(buf,"$n forces you to \'%s\'.",pcVar4);
  bVar1 = str_cmp(arg,"all");
  if (bVar1) {
    bVar1 = str_cmp(arg,"players");
    if (bVar1) {
      bVar1 = str_cmp(arg,"gods");
      if (bVar1) {
        pCVar5 = get_char_world(ch,arg);
        if (pCVar5 == (CHAR_DATA *)0x0) {
          pcVar4 = "They aren\'t here.\n\r";
          goto LAB_002ca437;
        }
        if (pCVar5 == ch) {
          pcVar4 = "Aye aye, right away!\n\r";
          goto LAB_002ca437;
        }
        bVar1 = is_room_owner(ch,pCVar5->in_room);
        if ((((!bVar1) && (ch->in_room != pCVar5->in_room)) &&
            (bVar1 = room_is_private(pCVar5->in_room), bVar1)) &&
           (bVar1 = is_trusted(ch,0x3c), !bVar1)) {
          pcVar4 = "That character is in a private room.\n\r";
          goto LAB_002ca437;
        }
        iVar2 = get_trust(pCVar5);
        iVar3 = get_trust(ch);
        if (iVar3 <= iVar2) {
          pcVar4 = "Do it yourself!\n\r";
          goto LAB_002ca437;
        }
        bVar1 = is_npc(pCVar5);
        if ((!bVar1) && (iVar2 = get_trust(ch), iVar2 < 0x39)) goto LAB_002ca58b;
        act(buf,ch,(void *)0x0,pCVar5,2);
        interpret(pCVar5,pcVar4);
      }
      else {
        iVar2 = get_trust(ch);
        pCVar5 = char_list;
        if (iVar2 < 0x3a) goto LAB_002ca58b;
        while (pCVar6 = pCVar5, pCVar6 != (CHAR_DATA *)0x0) {
          pCVar5 = pCVar6->next;
          bVar1 = is_npc(pCVar6);
          if (!bVar1) {
            iVar2 = get_trust(pCVar6);
            iVar3 = get_trust(ch);
            if ((iVar2 < iVar3) && (0x32 < pCVar6->level)) {
              act(buf,ch,(void *)0x0,pCVar6,2);
              interpret(pCVar6,pcVar4);
            }
          }
        }
      }
    }
    else {
      iVar2 = get_trust(ch);
      pCVar5 = char_list;
      if (iVar2 < 0x3a) goto LAB_002ca58b;
      while (pCVar6 = pCVar5, pCVar6 != (CHAR_DATA *)0x0) {
        pCVar5 = pCVar6->next;
        bVar1 = is_npc(pCVar6);
        if (!bVar1) {
          iVar2 = get_trust(pCVar6);
          iVar3 = get_trust(ch);
          if ((iVar2 < iVar3) && (pCVar6->level < 0x33)) {
            act(buf,ch,(void *)0x0,pCVar6,2);
            interpret(pCVar6,pcVar4);
          }
        }
      }
    }
  }
  else {
    iVar2 = get_trust(ch);
    if ((iVar2 < 0x39) && (bVar1 = str_cmp(arg2,"save"), bVar1)) {
LAB_002ca58b:
      pcVar4 = "Not at your level!\n\r";
      goto LAB_002ca437;
    }
    pCVar5 = char_list;
    while (pCVar6 = pCVar5, pCVar6 != (CHAR_DATA *)0x0) {
      pCVar5 = pCVar6->next;
      bVar1 = is_npc(pCVar6);
      if (!bVar1) {
        iVar2 = get_trust(pCVar6);
        iVar3 = get_trust(ch);
        if (iVar2 < iVar3) {
          bVar1 = can_see(pCVar6,ch);
          if (!bVar1) {
            sprintf(buf,"An irresistible urge forces you to \'%s\'.",pcVar4);
          }
          act(buf,ch,(void *)0x0,pCVar6,2);
          interpret(pCVar6,pcVar4);
        }
      }
    }
  }
  pcVar4 = "Ok.\n\r";
LAB_002ca437:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_force(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch, *vch_next;
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Force whom to do what?\n\r", ch);
		return;
	}

	one_argument(argument, arg2);

	if (!str_cmp(arg2, "delete") || !str_prefix(arg2, "mob"))
	{
		send_to_char("That will NOT be done.\n\r", ch);
		return;
	}

	sprintf(buf, "$n forces you to '%s'.", argument);

	if (!str_cmp(arg, "all"))
	{
		if (get_trust(ch) < MAX_LEVEL - 3 && str_cmp(arg2, "save"))
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch))
			{
				if (!can_see(vch, ch))
					sprintf(buf, "An irresistible urge forces you to '%s'.", argument);

				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "players"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level < LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "gods"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level >= LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else
	{
		CHAR_DATA *victim = get_char_world(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}

		if (victim == ch)
		{
			send_to_char("Aye aye, right away!\n\r", ch);
			return;
		}

		/*
		if(victim->desc == nullptr)
		{
			send_to_char("They have no descriptor!\n\r",ch);
			return;
		}
		*/

		if (!is_room_owner(ch, victim->in_room)
			&& ch->in_room != victim->in_room
			&& room_is_private(victim->in_room)
			&& !is_trusted(ch, IMPLEMENTOR))
		{
			send_to_char("That character is in a private room.\n\r", ch);
			return;
		}

		if (get_trust(victim) >= get_trust(ch))
		{
			send_to_char("Do it yourself!\n\r", ch);
			return;
		}

		if (!is_npc(victim) && get_trust(ch) < MAX_LEVEL - 3)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		act(buf, ch, nullptr, victim, TO_VICT);
		interpret(victim, argument);
	}

	send_to_char("Ok.\n\r", ch);
}